

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall QSplitter::~QSplitter(QSplitter *this)

{
  bool bVar1;
  QRubberBand *pQVar2;
  value_type pQVar3;
  QSplitterLayoutStruct *in_RDI;
  QSplitterPrivate *d;
  
  ((DataPointer *)&in_RDI->rect)->d = (Data *)&PTR_metaObject_00d1bdc0;
  *(undefined ***)&in_RDI->sizer = &PTR__QSplitter_00d1bf80;
  d_func((QSplitter *)0x69c40b);
  pQVar2 = ::QPointer::operator_cast_to_QRubberBand_((QPointer<QRubberBand> *)0x69c421);
  if (pQVar2 != (QRubberBand *)0x0) {
    (**(code **)(*(long *)&pQVar2->super_QWidget + 0x20))();
  }
  while (bVar1 = QList<QSplitterLayoutStruct_*>::isEmpty((QList<QSplitterLayoutStruct_*> *)0x69c44a)
        , ((bVar1 ^ 0xffU) & 1) != 0) {
    pQVar3 = QList<QSplitterLayoutStruct_*>::takeFirst((QList<QSplitterLayoutStruct_*> *)in_RDI);
    if (pQVar3 != (value_type)0x0) {
      QSplitterLayoutStruct::~QSplitterLayoutStruct(in_RDI);
      operator_delete(pQVar3,0x28);
    }
  }
  QFrame::~QFrame((QFrame *)0x69c490);
  return;
}

Assistant:

QSplitter::~QSplitter()
{
    Q_D(QSplitter);
#if QT_CONFIG(rubberband)
    delete d->rubberBand;
#endif
    while (!d->list.isEmpty())
        delete d->list.takeFirst();
}